

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O1

void duckdb_parquet::swap(AesGcmCtrV1 *a,AesGcmCtrV1 *b)

{
  bool bVar1;
  _AesGcmCtrV1__isset _Var2;
  
  std::__cxx11::string::swap((string *)&a->aad_prefix);
  std::__cxx11::string::swap((string *)&a->aad_file_unique);
  bVar1 = a->supply_aad_prefix;
  a->supply_aad_prefix = b->supply_aad_prefix;
  b->supply_aad_prefix = bVar1;
  _Var2 = a->__isset;
  a->__isset = b->__isset;
  b->__isset = _Var2;
  return;
}

Assistant:

void swap(AesGcmCtrV1 &a, AesGcmCtrV1 &b) {
  using ::std::swap;
  swap(a.aad_prefix, b.aad_prefix);
  swap(a.aad_file_unique, b.aad_file_unique);
  swap(a.supply_aad_prefix, b.supply_aad_prefix);
  swap(a.__isset, b.__isset);
}